

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O1

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::setDynamicDepthStencilState
          (DynamicStateBaseClass *this,float minDepthBounds,float maxDepthBounds,
          deUint32 stencilFrontCompareMask,deUint32 stencilFrontWriteMask,
          deUint32 stencilFrontReference,deUint32 stencilBackCompareMask,
          deUint32 stencilBackWriteMask,deUint32 stencilBackReference)

{
  (*this->m_vk->_vptr_DeviceInterface[0x52])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*this->m_vk->_vptr_DeviceInterface[0x53])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             stencilFrontCompareMask);
  (*this->m_vk->_vptr_DeviceInterface[0x54])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             (ulong)stencilFrontWriteMask);
  (*this->m_vk->_vptr_DeviceInterface[0x55])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             (ulong)stencilFrontReference);
  (*this->m_vk->_vptr_DeviceInterface[0x53])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             (ulong)stencilBackCompareMask);
  (*this->m_vk->_vptr_DeviceInterface[0x54])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             (ulong)stencilBackWriteMask);
  (*this->m_vk->_vptr_DeviceInterface[0x55])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             (ulong)stencilBackReference);
  return;
}

Assistant:

void DynamicStateBaseClass::setDynamicDepthStencilState (const float	minDepthBounds,
														 const float	maxDepthBounds,
														 const deUint32 stencilFrontCompareMask,
														 const deUint32 stencilFrontWriteMask,
														 const deUint32 stencilFrontReference,
														 const deUint32 stencilBackCompareMask,
														 const deUint32 stencilBackWriteMask,
														 const deUint32 stencilBackReference)
{
	m_vk.cmdSetDepthBounds(*m_cmdBuffer, minDepthBounds, maxDepthBounds);
	m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontCompareMask);
	m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontWriteMask);
	m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontReference);
	m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackCompareMask);
	m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackWriteMask);
	m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackReference);
}